

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O3

void OPLL_patch2dump(OPLL_PATCH *patch,e_uint8 *dump)

{
  *dump = (char)(patch->KR << 4) + (char)(patch->EG << 5) +
          (char)(patch->PM << 6) + (char)(patch->AM << 7) + (char)patch->ML;
  dump[1] = (char)(patch[1].KR << 4) + (char)(patch[1].EG << 5) +
            (char)(patch[1].PM << 6) + (char)(patch[1].AM << 7) + (char)patch[1].ML;
  dump[2] = (char)(patch->KL << 6) + (char)patch->TL;
  dump[3] = (char)(patch[1].WF << 4) + (char)(patch[1].KL << 6) + (char)patch->WF * '\b' +
            (char)patch->FB;
  dump[4] = (char)(patch->AR << 4) + (char)patch->DR;
  dump[5] = (char)(patch[1].AR << 4) + (char)patch[1].DR;
  dump[6] = (char)(patch->SL << 4) + (char)patch->RR;
  dump[7] = (char)(patch[1].SL << 4) + (char)patch[1].RR;
  dump[8] = '\0';
  dump[9] = '\0';
  dump[10] = '\0';
  dump[0xb] = '\0';
  dump[0xc] = '\0';
  dump[0xd] = '\0';
  dump[0xe] = '\0';
  dump[0xf] = '\0';
  return;
}

Assistant:

void
OPLL_patch2dump (const OPLL_PATCH * patch, e_uint8 * dump)
{
  dump[0] = (e_uint8) ((patch[0].AM << 7) + (patch[0].PM << 6) + (patch[0].EG << 5) + (patch[0].KR << 4) + patch[0].ML);
  dump[1] = (e_uint8) ((patch[1].AM << 7) + (patch[1].PM << 6) + (patch[1].EG << 5) + (patch[1].KR << 4) + patch[1].ML);
  dump[2] = (e_uint8) ((patch[0].KL << 6) + patch[0].TL);
  dump[3] = (e_uint8) ((patch[1].KL << 6) + (patch[1].WF << 4) + (patch[0].WF << 3) + patch[0].FB);
  dump[4] = (e_uint8) ((patch[0].AR << 4) + patch[0].DR);
  dump[5] = (e_uint8) ((patch[1].AR << 4) + patch[1].DR);
  dump[6] = (e_uint8) ((patch[0].SL << 4) + patch[0].RR);
  dump[7] = (e_uint8) ((patch[1].SL << 4) + patch[1].RR);
  dump[8] = 0;
  dump[9] = 0;
  dump[10] = 0;
  dump[11] = 0;
  dump[12] = 0;
  dump[13] = 0;
  dump[14] = 0;
  dump[15] = 0;
}